

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_type_getCanonicalPendingInstanceType(sysbvm_context_t *context,sysbvm_tuple_t type)

{
  ulong *puVar1;
  ulong uVar2;
  _Bool _Var3;
  sysbvm_tuple_t sVar4;
  ulong uVar5;
  sysbvm_pointerLikeType_t *pointerLikeType;
  sysbvm_tuple_t local_28;
  undefined8 local_20;
  
  _Var3 = sysbvm_tuple_isKindOf(context,type,(context->roots).referenceType);
  if (_Var3) {
    local_28 = sysbvm_type_getCanonicalPendingInstanceType(context,*(sysbvm_tuple_t *)(type + 0xf8))
    ;
    local_20 = *(undefined8 *)(type + 0x100);
    sVar4 = sysbvm_function_apply(context,(context->roots).referenceTypeTemplate,2,&local_28,0);
  }
  else {
    uVar2 = (context->roots).metatypeType;
    if ((((uVar2 & 0xf) == 0 && uVar2 != 0) && ((type & 0xf) == 0 && type != 0)) &&
       (uVar5 = type, (*(byte *)(type + 8) & 0x80) == 0)) {
      do {
        if (uVar5 == uVar2) {
          if (*(sysbvm_tuple_t *)(type + 0xf8) != 0) {
            return *(sysbvm_tuple_t *)(type + 0xf8);
          }
          break;
        }
        puVar1 = (ulong *)(uVar5 + 0x30);
        uVar5 = *puVar1;
      } while (*puVar1 != 0);
    }
    sVar4 = (context->roots).anyValueType;
  }
  return sVar4;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_getCanonicalPendingInstanceType(sysbvm_context_t *context, sysbvm_tuple_t type)
{
    // FIXME: Check the validity of this condition.
    if(sysbvm_tuple_isKindOf(context, type, context->roots.referenceType))
    {
        sysbvm_pointerLikeType_t *pointerLikeType = (sysbvm_pointerLikeType_t*)type;
        return sysbvm_type_createReferenceType(context, sysbvm_type_getCanonicalPendingInstanceType(context, pointerLikeType->baseType), pointerLikeType->addressSpace);
    }

    if(sysbvm_type_isDirectSubtypeOf(type, context->roots.metatypeType))
    {
        sysbvm_tuple_t thisType = ((sysbvm_metatype_t*)type)->thisType;
        if(thisType)
            return thisType;
    }
    
    return context->roots.anyValueType;
}